

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  bool bVar1;
  unsigned_long *puVar2;
  uint64_t id;
  NullableValue<capnp::InterfaceSchema> *other;
  InterfaceSchema *pIVar3;
  InterfaceSchema *t;
  int *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar4;
  Maybe<capnp::InterfaceSchema> MVar5;
  InterfaceSchema *result;
  Schema local_198;
  Maybe<capnp::InterfaceSchema> local_190;
  undefined1 local_180 [8];
  NullableValue<capnp::InterfaceSchema> _result687;
  undefined1 local_168 [4];
  uint location;
  Reader superclass;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  Reader local_d8;
  undefined1 local_a8 [8];
  Reader superclasses;
  Fault local_60;
  Fault f;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int,_const_unsigned_int_&> _kjCondition;
  uint *counter_local;
  uint64_t typeId_local;
  InterfaceSchema *this_local;
  
  f.exception._0_4_ = *in_RCX;
  *in_RCX = (int)f.exception + 1;
  f.exception._4_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&f);
  kj::_::DebugExpression<unsigned_int>::operator<
            ((DebugComparison<unsigned_int,_const_unsigned_int_&> *)local_50,
             (DebugExpression<unsigned_int> *)((long)&f.exception + 4),&MAX_SUPERCLASSES);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (bVar1) {
    if (counter == *(uint **)**(undefined8 **)typeId) {
      kj::Maybe<capnp::InterfaceSchema>::Maybe
                ((Maybe<capnp::InterfaceSchema> *)this,(InterfaceSchema *)typeId);
      aVar4 = extraout_RDX_00;
    }
    else {
      Schema::getProto((Reader *)&__range1,(Schema *)typeId);
      capnp::schema::Node::Reader::getInterface(&local_d8,(Reader *)&__range1);
      capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)local_a8,&local_d8);
      ___begin1 = kj::indices<capnp::List<capnp::schema::Superclass,(capnp::Kind)3>::Reader&>
                            ((Reader *)local_a8);
      __end1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
      while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        puVar2 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
        superclass._reader._40_8_ = *puVar2;
        List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_168,(Reader *)local_a8,superclass._reader.nestingLimit);
        _result687.field_1._4_4_ =
             capnp::_::RawBrandedSchema::makeDepLocation(SUPERCLASS,superclass._reader.nestingLimit)
        ;
        id = capnp::schema::Superclass::Reader::getId((Reader *)local_168);
        result = (InterfaceSchema *)
                 Schema::getDependency((Schema *)typeId,id,_result687.field_1._4_4_);
        local_198.raw = (RawBrandedSchema *)Schema::asInterface((Schema *)&result);
        findSuperclass((InterfaceSchema *)&local_190,(uint64_t)&local_198,counter);
        other = kj::_::readMaybe<capnp::InterfaceSchema>(&local_190);
        kj::_::NullableValue<capnp::InterfaceSchema>::NullableValue
                  ((NullableValue<capnp::InterfaceSchema> *)local_180,other);
        kj::Maybe<capnp::InterfaceSchema>::~Maybe(&local_190);
        pIVar3 = kj::_::NullableValue::operator_cast_to_InterfaceSchema_((NullableValue *)local_180)
        ;
        if (pIVar3 != (InterfaceSchema *)0x0) {
          t = kj::_::NullableValue<capnp::InterfaceSchema>::operator*
                        ((NullableValue<capnp::InterfaceSchema> *)local_180);
          kj::Maybe<capnp::InterfaceSchema>::Maybe((Maybe<capnp::InterfaceSchema> *)this,t);
        }
        kj::_::NullableValue<capnp::InterfaceSchema>::~NullableValue
                  ((NullableValue<capnp::InterfaceSchema> *)local_180);
        aVar4 = extraout_RDX_01;
        if (pIVar3 != (InterfaceSchema *)0x0) goto LAB_005ae76f;
        kj::Range<unsigned_long>::Iterator::operator++(&__end1);
      }
      kj::Maybe<capnp::InterfaceSchema>::Maybe((Maybe<capnp::InterfaceSchema> *)this);
      aVar4 = extraout_RDX_02;
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x2a0,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)local_50,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::Maybe<capnp::InterfaceSchema>::Maybe((Maybe<capnp::InterfaceSchema> *)this);
    kj::_::Debug::Fault::~Fault(&local_60);
    aVar4 = extraout_RDX;
  }
LAB_005ae76f:
  MVar5.ptr.field_1.field1 = aVar4.field1;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar5.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_SOME(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return result;
    }
  }

  return kj::none;
}